

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O1

ze_result_t zesGetRasProcAddrTable(ze_api_version_t version,zes_ras_dditable_t *pDdiTable)

{
  ze_api_version_t *pzVar1;
  ze_result_t zVar2;
  
  pzVar1 = validation_layer::context;
  if (pDdiTable == (zes_ras_dditable_t *)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar2 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      *(zes_pfnRasGetProperties_t *)(validation_layer::context + 0x328) =
           pDdiTable->pfnGetProperties;
      pDdiTable->pfnGetProperties = validation_layer::zesRasGetProperties;
      *(zes_pfnRasGetConfig_t *)(pzVar1 + 0x32a) = pDdiTable->pfnGetConfig;
      pDdiTable->pfnGetConfig = validation_layer::zesRasGetConfig;
      *(zes_pfnRasSetConfig_t *)(pzVar1 + 0x32c) = pDdiTable->pfnSetConfig;
      pDdiTable->pfnSetConfig = validation_layer::zesRasSetConfig;
      *(zes_pfnRasGetState_t *)(pzVar1 + 0x32e) = pDdiTable->pfnGetState;
      pDdiTable->pfnGetState = validation_layer::zesRasGetState;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetRasProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_ras_dditable_t* pDdiTable                   ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zesDdiTable.Ras;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = validation_layer::zesRasGetProperties;

    dditable.pfnGetConfig                                = pDdiTable->pfnGetConfig;
    pDdiTable->pfnGetConfig                              = validation_layer::zesRasGetConfig;

    dditable.pfnSetConfig                                = pDdiTable->pfnSetConfig;
    pDdiTable->pfnSetConfig                              = validation_layer::zesRasSetConfig;

    dditable.pfnGetState                                 = pDdiTable->pfnGetState;
    pDdiTable->pfnGetState                               = validation_layer::zesRasGetState;

    return result;
}